

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcManager.cpp
# Opt level: O0

GdlGlyphClassDefn * __thiscall GrcManager::AddAnonymousClass(GrcManager *this,GrpLineAndFile *lnf)

{
  Symbol this_00;
  GdlDefn *pGVar1;
  GrpLineAndFile *in_stack_00000048;
  GrcSymbolTable *in_stack_00000050;
  GdlGlyphClassDefn *pglfc;
  Symbol psymClass;
  GdlGlyphClassDefn *in_stack_ffffffffffffff88;
  GdlGlyphClassDefn *sta;
  GdlRenderer *in_stack_ffffffffffffff90;
  GdlGlyphClassDefn *this_01;
  GdlGlyphClassDefn *local_68;
  int in_stack_ffffffffffffffc4;
  GrcSymbolTableEntry *in_stack_ffffffffffffffc8;
  
  this_00 = GrcSymbolTable::AddAnonymousClassSymbol(in_stack_00000050,in_stack_00000048);
  pGVar1 = GrcSymbolTableEntry::Data(this_00);
  if (pGVar1 == (GdlDefn *)0x0) {
    local_68 = (GdlGlyphClassDefn *)0x0;
  }
  else {
    local_68 = (GdlGlyphClassDefn *)
               __dynamic_cast(pGVar1,&GdlDefn::typeinfo,&GdlGlyphClassDefn::typeinfo,0);
  }
  GdlRenderer::AddGlyphClass(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  this_01 = (GdlGlyphClassDefn *)&stack0xffffffffffffffc0;
  sta = local_68;
  GrcSymbolTableEntry::FieldAt_abi_cxx11_(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  GdlGlyphClassDefn::SetName(this_01,(string *)sta);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  return local_68;
}

Assistant:

GdlGlyphClassDefn * GrcManager::AddAnonymousClass(GrpLineAndFile const& lnf)
{
	Symbol psymClass = m_psymtbl->AddAnonymousClassSymbol(lnf);
	GdlGlyphClassDefn * pglfc = dynamic_cast<GdlGlyphClassDefn*>(psymClass->Data());
	Assert(pglfc);
	m_prndr->AddGlyphClass(pglfc);
	pglfc->SetName(std::string(psymClass->FieldAt(0)));
	return pglfc;
}